

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::BuildUniqueBoneList
               (list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *asBones,
               const_iterator it,const_iterator end)

{
  uint uVar1;
  list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *this;
  bool bVar2;
  uint32_t uVar3;
  reference ppaVar4;
  reference pBVar5;
  vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
  *this_00;
  pair<aiBone_*,_unsigned_int> local_b0;
  reference local_a0;
  BoneWithHash *btz;
  BoneWithHash local_88;
  pair<aiBone_*,_unsigned_int> local_58;
  _Self local_48;
  iterator end2;
  iterator it2;
  aiBone *paStack_30;
  uint32_t itml;
  aiBone *p;
  uint l;
  uint iOffset;
  list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *asBones_local;
  const_iterator end_local;
  const_iterator it_local;
  
  p._4_4_ = 0;
  _l = asBones;
  asBones_local =
       (list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *)end._M_current;
  end_local._M_current = it._M_current;
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&end_local,
                       (__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        *)&asBones_local);
    if (!bVar2) {
      return;
    }
    for (p._0_4_ = 0; uVar1 = (uint)p,
        ppaVar4 = __gnu_cxx::
                  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                  ::operator*(&end_local), uVar1 < (*ppaVar4)->mNumBones; p._0_4_ = (uint)p + 1) {
      ppaVar4 = __gnu_cxx::
                __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                ::operator*(&end_local);
      paStack_30 = (*ppaVar4)->mBones[(uint)p];
      uVar3 = SuperFastHash((paStack_30->mName).data,(paStack_30->mName).length,0);
      end2 = std::__cxx11::list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>::begin
                       (_l);
      local_48._M_node =
           (_List_node_base *)
           std::__cxx11::list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>::end(_l);
      while (bVar2 = std::operator!=(&end2,&local_48), bVar2) {
        pBVar5 = std::_List_iterator<Assimp::BoneWithHash>::operator*(&end2);
        if ((pBVar5->super_pair<unsigned_int,_aiString_*>).first == uVar3) {
          pBVar5 = std::_List_iterator<Assimp::BoneWithHash>::operator*(&end2);
          std::pair<aiBone_*,_unsigned_int>::pair<aiBone_*&,_unsigned_int_&,_true>
                    (&local_58,&stack0xffffffffffffffd0,(uint *)((long)&p + 4));
          std::
          vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
          ::push_back(&pBVar5->pSrcBones,&local_58);
          break;
        }
        std::_List_iterator<Assimp::BoneWithHash>::operator++(&end2);
      }
      bVar2 = std::operator==(&local_48,&end2);
      this = _l;
      if (bVar2) {
        local_88.pSrcBones.
        super__Vector_base<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.pSrcBones.
        super__Vector_base<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.super_pair<unsigned_int,_aiString_*>.first = 0;
        local_88.super_pair<unsigned_int,_aiString_*>._4_4_ = 0;
        local_88.super_pair<unsigned_int,_aiString_*>.second = (aiString *)0x0;
        local_88.pSrcBones.
        super__Vector_base<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        BoneWithHash::BoneWithHash(&local_88);
        std::__cxx11::list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>::push_back
                  (this,&local_88);
        BoneWithHash::~BoneWithHash(&local_88);
        local_a0 = std::__cxx11::list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>::
                   back(_l);
        (local_a0->super_pair<unsigned_int,_aiString_*>).first = uVar3;
        (local_a0->super_pair<unsigned_int,_aiString_*>).second = &paStack_30->mName;
        this_00 = &local_a0->pSrcBones;
        std::pair<aiBone_*,_unsigned_int>::pair<aiBone_*&,_unsigned_int_&,_true>
                  (&local_b0,&stack0xffffffffffffffd0,(uint *)((long)&p + 4));
        std::
        vector<std::pair<aiBone_*,_unsigned_int>,_std::allocator<std::pair<aiBone_*,_unsigned_int>_>_>
        ::push_back(this_00,&local_b0);
      }
    }
    ppaVar4 = __gnu_cxx::
              __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
              ::operator*(&end_local);
    p._4_4_ = (*ppaVar4)->mNumVertices + p._4_4_;
    __gnu_cxx::__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
    ::operator++(&end_local);
  } while( true );
}

Assistant:

void SceneCombiner::BuildUniqueBoneList(std::list<BoneWithHash>& asBones,
    std::vector<aiMesh*>::const_iterator it,
    std::vector<aiMesh*>::const_iterator end)
{
    unsigned int iOffset = 0;
    for (; it != end;++it)  {
        for (unsigned int l = 0; l < (*it)->mNumBones;++l)  {
            aiBone* p = (*it)->mBones[l];
            uint32_t itml = SuperFastHash(p->mName.data,(unsigned int)p->mName.length);

            std::list<BoneWithHash>::iterator it2  = asBones.begin();
            std::list<BoneWithHash>::iterator end2 = asBones.end();

            for (;it2 != end2;++it2)    {
                if ((*it2).first == itml)   {
                    (*it2).pSrcBones.push_back(BoneSrcIndex(p,iOffset));
                    break;
                }
            }
            if (end2 == it2)    {
                // need to begin a new bone entry
                asBones.push_back(BoneWithHash());
                BoneWithHash& btz = asBones.back();

                // setup members
                btz.first = itml;
                btz.second = &p->mName;
                btz.pSrcBones.push_back(BoneSrcIndex(p,iOffset));
            }
        }
        iOffset += (*it)->mNumVertices;
    }
}